

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

bool __thiscall IMLE::loadParameters(IMLE *this,string *fname)

{
  char cVar1;
  xml_iarchive ia;
  Param newParams;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  xml_iarchive local_360;
  Param local_2d0;
  istream local_228 [520];
  
  Param::Param(&local_2d0,this->d,this->D);
  std::ifstream::ifstream(local_228,(fname->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&local_380,"IMLE: Could not open file ",fname);
    local_360._0_8_ = &local_360.field_0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,local_380._M_dataplus._M_p,
               local_380._M_dataplus._M_p + (long)(int *)local_380._M_string_length);
    std::__cxx11::string::append((char *)&local_360);
    message(this,(string *)&local_360);
    if ((undefined1 *)local_360._0_8_ != &local_360.field_0x10) {
      operator_delete((void *)local_360._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p);
    }
  }
  else {
    boost::archive::xml_iarchive::xml_iarchive(&local_360,local_228,0);
    local_380._M_dataplus._M_p = "newParams";
    local_380._M_string_length = (size_type)&local_2d0;
    boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<IMLE::Param>
              ((basic_xml_iarchive<boost::archive::xml_iarchive> *)&local_360,
               (nvp<IMLE::Param> *)&local_380);
    std::ifstream::close();
    setParameters(this,&local_2d0);
    boost::archive::xml_iarchive_impl<boost::archive::xml_iarchive>::~xml_iarchive_impl
              (&local_360.super_xml_iarchive_impl<boost::archive::xml_iarchive>);
  }
  std::ifstream::~ifstream(local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.defaultSave._M_dataplus._M_p != &local_2d0.defaultSave.field_2) {
    operator_delete(local_2d0.defaultSave._M_dataplus._M_p);
  }
  free(local_2d0.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return (bool)cVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::loadParameters(std::string const &fname)
{
#ifdef IMLE_NO_TEMPLATES
    Param newParams(d,D);
#else
    Param newParams;
#endif

    std::ifstream ifs(fname.c_str());
    	if( !ifs.is_open() )
	{
		message(OPENERR + fname + "!!");
		return false;
	}

    assert(ifs.good());
    boost::archive::xml_iarchive ia(ifs);
    ia & BOOST_SERIALIZATION_NVP(newParams);
    ifs.close();

    setParameters(newParams);

	return true;
}